

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

string * __thiscall
Json::Value::getComment_abi_cxx11_
          (string *__return_storage_ptr__,Value *this,CommentPlacement placement)

{
  char *pcVar1;
  bool bVar2;
  allocator local_2d [16];
  allocator local_1d;
  CommentPlacement local_1c;
  Value *pVStack_18;
  CommentPlacement placement_local;
  Value *this_local;
  
  local_1c = placement;
  pVStack_18 = this;
  this_local = (Value *)__return_storage_ptr__;
  bVar2 = hasComment(this,placement);
  if (bVar2) {
    pcVar1 = this->comments_[local_1c].comment_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_1d);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Value::getComment(CommentPlacement placement) const {
  if (hasComment(placement))
    return comments_[placement].comment_;
  return "";
}